

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalJacobianPreInt
          (ChElementBeamANCF_3243 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  Matrix<double,__1,__1,_0,__1,__1> *a_rhs;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 (*pauVar3) [64];
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *pdVar11;
  PointerType pdVar12;
  double *pdVar13;
  char *pcVar14;
  double *pdVar15;
  PointerType pdVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  PointerType pdVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  double *pdVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict ScaledMassMatrix;
  Matrix3xN e_bar;
  MatrixNxN K_K13Compact;
  Matrix3xN e_bar_dot;
  ChMatrixNMc<double,_9,_NSF_*_NSF> K2;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_64,_0,_9,_64>_>
  *local_2980;
  Scalar local_2920;
  double dStack_2918;
  double dStack_2910;
  double dStack_2908;
  double local_2900;
  double dStack_28f8;
  double dStack_28f0;
  double dStack_28e8;
  double local_28e0;
  double dStack_28d8;
  double dStack_28d0;
  double dStack_28c8;
  double local_28c0;
  double dStack_28b8;
  double dStack_28b0;
  double dStack_28a8;
  double local_28a0;
  double dStack_2898;
  double dStack_2890;
  double dStack_2888;
  double local_2880;
  double dStack_2878;
  double dStack_2870;
  double dStack_2868;
  double local_2860;
  double dStack_2858;
  double dStack_2850;
  double dStack_2848;
  double local_2840;
  double dStack_2838;
  double dStack_2830;
  double dStack_2828;
  double local_2820;
  double dStack_2818;
  double dStack_2810;
  double dStack_2808;
  undefined1 local_2800 [128];
  undefined1 local_2780 [64];
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_64,_0,_9,_64>_>
  local_2740;
  Matrix<double,__1,__1,_0,__1,__1> *local_2730;
  undefined1 local_2540 [64];
  undefined1 local_2500 [64];
  undefined1 local_24c0 [56];
  double dStack_2488;
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_2400 [64];
  Matrix<double,_9,_64,_0,_9,_64> local_1280;
  
  CalcCoordMatrix(this,(Matrix3xN *)local_2800);
  CalcCoordDerivMatrix(this,(Matrix3xN *)local_2540);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = this->m_Alpha;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = Rfactor;
  auVar9._8_8_ = in_XMM0_Qb;
  auVar9._0_8_ = Kfactor;
  pdVar11 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.
            m_data.array + 2;
  pdVar15 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.
            m_data.array + 8;
  lVar19 = 0;
  auVar29 = vfmadd213sd_fma(auVar43,auVar42,auVar9);
  local_2480._0_8_ = this->m_Alpha * Kfactor;
  local_2480._8_8_ = (Matrix3xN *)local_2540;
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [0] = auVar29._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_2480._0_8_;
  auVar30 = vbroadcastsd_avx512f(auVar29);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage
                 .m_data.array[0];
  auVar31 = vbroadcastsd_avx512f(auVar2);
  auVar32 = vmulpd_avx512f(auVar30,local_2540);
  auVar33 = vmulpd_avx512f(auVar30,local_2500);
  auVar30 = vmulpd_avx512f(auVar30,_local_24c0);
  auVar34 = vmulpd_avx512f(auVar31,local_2800._0_64_);
  auVar32 = vaddpd_avx512f(auVar34,auVar32);
  auVar34 = vmulpd_avx512f(auVar31,local_2800._64_64_);
  auVar31 = vmulpd_avx512f(auVar31,local_2780);
  pdVar13 = local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.
            m_data.array + 5;
  auVar33 = vaddpd_avx512f(auVar34,auVar33);
  auVar30 = vaddpd_avx512f(auVar31,auVar30);
  auVar31 = vpermpd_avx512f(_DAT_009a3d00,auVar30);
  auVar34 = vpermpd_avx512f(_DAT_009a3d40,auVar30);
  auVar35 = vpermpd_avx512f(_DAT_009a3d00,auVar33);
  auVar36 = vpermpd_avx512f(_DAT_009a3d40,auVar33);
  auVar30 = vpermpd_avx512f(_DAT_009a3d80,auVar30);
  auVar33 = vpermpd_avx512f(_DAT_009a3d80,auVar33);
  auVar37 = vpermpd_avx512f(_DAT_009a3d00,auVar32);
  auVar38 = vpermpd_avx512f(_DAT_009a3d40,auVar32);
  auVar32 = vpermpd_avx512f(_DAT_009a3d80,auVar32);
  local_1280.super_PlainObjectBase<Eigen::Matrix<double,_9,_64,_0,_9,_64>_>.m_storage.m_data.array
  [1] = (double)local_2800;
  do {
    auVar44._8_8_ = 0;
    auVar44._0_8_ = *(ulong *)(local_2800 + lVar19 * 8);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = *(ulong *)(local_2800 + lVar19 * 8 + 0x40);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = *(ulong *)(local_2780 + lVar19 * 8);
    lVar23 = 0x10;
    auVar29 = vunpcklpd_avx(auVar44,auVar45);
    auVar39 = vpermpd_avx512f(_DAT_009a3dc0,
                              ZEXT2464(CONCAT816(*(ulong *)(local_2780 + lVar19 * 8),auVar29)));
    local_2480 = vmulpd_avx512f(auVar37,auVar39);
    auVar29 = vunpcklpd_avx(auVar46,auVar44);
    auVar2 = vunpcklpd_avx(auVar45,auVar46);
    auVar40 = vpermpd_avx512f(_DAT_009a3dc0,
                              ZEXT2464(CONCAT816(*(ulong *)(local_2800 + lVar19 * 8 + 0x40),auVar29)
                                      ));
    auVar41 = vpermpd_avx512f(_DAT_009a3dc0,
                              ZEXT2464(CONCAT816(*(ulong *)(local_2800 + lVar19 * 8),auVar2)));
    local_2440 = vmulpd_avx512f(auVar38,auVar40);
    local_2400 = vmulpd_avx512f(auVar32,auVar41);
    pdVar26 = pdVar11;
    do {
      lVar28 = lVar23 + 0x30;
      dVar8 = *(double *)(local_24c0 + lVar23 + 0x38);
      dVar1 = *(double *)(local_2480 + lVar23);
      lVar23 = lVar23 + 0x18;
      ((plain_array<double,_576,_0,_64> *)(pdVar26 + -2))->array[0] =
           *(double *)(local_24c0 + lVar28);
      pdVar26[-1] = dVar8;
      *pdVar26 = dVar1;
      pdVar26 = pdVar26 + 9;
    } while (lVar23 != 0xd0);
    local_2480 = vmulpd_avx512f(auVar35,auVar39);
    local_2440 = vmulpd_avx512f(auVar36,auVar40);
    local_2400 = vmulpd_avx512f(auVar33,auVar41);
    lVar23 = 0x10;
    pdVar26 = pdVar13;
    do {
      lVar28 = lVar23 + 0x30;
      dVar8 = *(double *)(local_24c0 + lVar23 + 0x38);
      dVar1 = *(double *)(local_2480 + lVar23);
      lVar23 = lVar23 + 0x18;
      pdVar26[-2] = *(double *)(local_24c0 + lVar28);
      pdVar26[-1] = dVar8;
      *pdVar26 = dVar1;
      pdVar26 = pdVar26 + 9;
    } while (lVar23 != 0xd0);
    local_2480 = vmulpd_avx512f(auVar31,auVar39);
    local_2440 = vmulpd_avx512f(auVar34,auVar40);
    local_2400 = vmulpd_avx512f(auVar30,auVar41);
    lVar23 = 0x10;
    pdVar26 = pdVar15;
    do {
      lVar28 = lVar23 + 0x30;
      dVar8 = *(double *)(local_24c0 + lVar23 + 0x38);
      dVar1 = *(double *)(local_2480 + lVar23);
      lVar23 = lVar23 + 0x18;
      pdVar26[-2] = *(double *)(local_24c0 + lVar28);
      pdVar26[-1] = dVar8;
      *pdVar26 = dVar1;
      pdVar26 = pdVar26 + 9;
    } while (lVar23 != 0xd0);
    lVar19 = lVar19 + 1;
    pdVar11 = pdVar11 + 0x48;
    pdVar13 = pdVar13 + 0x48;
    pdVar15 = pdVar15 + 0x48;
  } while (lVar19 != 8);
  local_2740.m_xpr = &local_1280;
  a_rhs = &this->m_O2;
  local_2730 = a_rhs;
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
      != 0x40) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 64, 0>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 64, 0>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                 );
  }
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 0x40) {
    lVar28 = 0;
    memset((Matrix<double,_9,_64,_0,_9,_64> *)local_2480,0,0x1200);
    local_2980 = &local_2740;
    local_2920 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,64,0,9,64>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,9,64,0,9,64>>
              ((Matrix<double,_9,_64,_0,_9,_64> *)local_2480,local_2980,a_rhs,&local_2920);
    lVar19 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).m_stride.m_outer.m_value;
    pdVar12 = (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_data;
    lVar23 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value;
    pdVar11 = (double *)(local_2480 + 0x40);
    pdVar16 = pdVar12 + lVar19;
    pdVar20 = pdVar12 + lVar19 * 2;
    do {
      if (lVar23 < lVar28 * 3 + 3) {
LAB_00711dde:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                     );
      }
      lVar27 = 2;
      pdVar15 = pdVar11;
      do {
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar27 + -2) goto LAB_00711dde;
        pdVar12[lVar27 + -2] = pdVar15[-8];
        pdVar16[lVar27 + -2] = pdVar15[-7];
        pdVar20[lVar27 + -2] = pdVar15[-6];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar27 + -1) goto LAB_00711dde;
        pdVar12[lVar27 + -1] = pdVar15[-5];
        pdVar16[lVar27 + -1] = pdVar15[-4];
        pdVar20[lVar27 + -1] = pdVar15[-3];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar27) goto LAB_00711dde;
        pdVar12[lVar27] = pdVar15[-2];
        pdVar16[lVar27] = pdVar15[-1];
        dVar1 = *pdVar15;
        pdVar15 = pdVar15 + 0x48;
        pdVar20[lVar27] = dVar1;
        lVar27 = lVar27 + 3;
      } while (lVar27 != 0x1a);
      lVar28 = lVar28 + 1;
      pdVar12 = pdVar12 + lVar19 * 3;
      pdVar16 = pdVar16 + lVar19 * 3;
      pdVar20 = pdVar20 + lVar19 * 3;
      pdVar11 = pdVar11 + 9;
    } while (lVar28 != 8);
    uVar17 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    uVar24 = (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    if ((long)(uVar17 | uVar24) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((uVar24 == 8) && (uVar17 == 8)) {
      auVar10._8_8_ = in_XMM0_Qb;
      auVar10._0_8_ = Kfactor;
      pauVar3 = (undefined1 (*) [64])
                (this->m_K13Compact).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      lVar28 = 8;
      lVar27 = 0;
      uVar24 = 0;
      auVar7._8_8_ = 0x8000000000000000;
      auVar7._0_8_ = 0x8000000000000000;
      auVar29 = vxorpd_avx512vl(auVar10,auVar7);
      auVar30 = vbroadcastsd_avx512f(auVar29);
      auVar31 = vmulpd_avx512f(auVar30,*pauVar3);
      vscatterdpd_avx512f(ZEXT864(&local_2740) + ZEXT3264(_DAT_009a4280),0xffff,auVar31);
      auVar31 = vmulpd_avx512f(auVar30,pauVar3[1]);
      vscatterdpd_avx512f(ZEXT864(&local_2740.field_0x8) + ZEXT3264(_DAT_009a4280),0xffff,auVar31);
      lVar23 = -0xfffffff2;
      auVar31 = vmulpd_avx512f(auVar30,pauVar3[2]);
      vscatterdpd_avx512f(ZEXT864(&local_2740) + ZEXT3264(_DAT_009a42c0),0xffff,auVar31);
      auVar31 = vmulpd_avx512f(auVar30,pauVar3[3]);
      vscatterdpd_avx512f(ZEXT864(&local_2740) + ZEXT3264(_DAT_009a42e0),0xffff,auVar31);
      auVar31 = vmulpd_avx512f(auVar30,pauVar3[4]);
      vscatterdpd_avx512f(ZEXT864(&local_2740) + ZEXT3264(_DAT_009a4300),0xffff,auVar31);
      auVar31 = vmulpd_avx512f(auVar30,pauVar3[5]);
      vscatterdpd_avx512f(ZEXT864(&local_2740) + ZEXT3264(_DAT_009a4320),0xffff,auVar31);
      auVar31 = vmulpd_avx512f(auVar30,pauVar3[6]);
      vscatterdpd_avx512f(ZEXT864(&local_2740) + ZEXT3264(_DAT_009a4340),0xffff,auVar31);
      auVar30 = vmulpd_avx512f(auVar30,pauVar3[7]);
      vscatterdpd_avx512f(ZEXT864(&local_2740) + ZEXT3264(_DAT_009a4360),0xffff,auVar30);
      uVar17 = 0;
      lVar19 = 0x10;
      local_2920 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0];
      dStack_2918 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[1];
      dStack_2910 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[2];
      dStack_2908 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[3];
      local_2900 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[4];
      dStack_28f8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[5];
      dStack_28f0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[6];
      dStack_28e8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[7];
      local_28e0 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[8];
      dStack_28d8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[9];
      dStack_28d0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[10];
      dStack_28c8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0xb];
      local_28c0 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0xc];
      dStack_28b8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0xd];
      dStack_28b0 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0xe];
      dStack_28a8 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0xf];
      local_28a0 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0x10];
      dStack_2898 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x11];
      dStack_2890 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x12];
      dStack_2888 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x13];
      local_2880 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0x14];
      dStack_2878 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x15];
      dStack_2870 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x16];
      dStack_2868 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x17];
      local_2860 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0x18];
      dStack_2858 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x19];
      dStack_2850 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x1a];
      dStack_2848 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x1b];
      local_2840 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0x1c];
      dStack_2838 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x1d];
      dStack_2830 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x1e];
      dStack_2828 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x1f];
      local_2820 = Mfactor * (this->m_MassMatrix).
                             super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                             m_storage.m_data.array[0x20];
      dStack_2818 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x21];
      dStack_2810 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x22];
      dStack_2808 = Mfactor * (this->m_MassMatrix).
                              super_PlainObjectBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>_>.
                              m_storage.m_data.array[0x23];
      do {
        lVar4 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).m_stride.m_outer.m_value;
        pdVar16 = (H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        uVar5 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value;
        uVar6 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value;
        uVar18 = 0;
        iVar22 = 8;
        uVar21 = 2;
        do {
          if (uVar18 < uVar24) {
            uVar25 = (((int)uVar18 + -7) * iVar22 + 0x38U >> 1) + (int)uVar24;
          }
          else {
            uVar25 = ((uint)(uVar17 >> 1) & 0x7fffffff) + (int)uVar18;
          }
          if (0x23 < uVar25) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 36, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 36, 1>, Level = 1]"
                         );
          }
          if (7 < (uVar18 | uVar24)) {
            pcVar14 = 
            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 8, 8, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, 8, 8, 1>, Level = 1]"
            ;
            goto LAB_00711e4b;
          }
          if (((long)uVar5 <= (long)(uVar24 * 3)) || ((long)uVar6 <= (long)(uVar21 - 2))) {
LAB_00711dfd:
            pcVar14 = 
            "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
            ;
LAB_00711e4b:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,pcVar14);
          }
          dVar1 = (&local_2920)[uVar25] + (double)(&local_2980->m_xpr)[uVar18];
          *(double *)((long)pdVar16 + uVar21 * 8 + lVar4 * lVar27 + -0x10) =
               dVar1 + *(double *)((long)pdVar16 + uVar21 * 8 + lVar4 * lVar27 + -0x10);
          if ((uVar5 <= uVar24 * 3 + 1) ||
             (((uVar6 <= uVar21 - 1 ||
               (*(double *)((long)pdVar16 + uVar21 * 8 + lVar4 * lVar28 + -8) =
                     dVar1 + *(double *)((long)pdVar16 + uVar21 * 8 + lVar4 * lVar28 + -8),
               uVar5 <= uVar24 * 3 + 2)) || (uVar6 <= uVar21)))) goto LAB_00711dfd;
          uVar18 = uVar18 + 1;
          iVar22 = iVar22 + -1;
          *(double *)((long)pdVar16 + uVar21 * 8 + lVar4 * lVar19) =
               dVar1 + *(double *)((long)pdVar16 + uVar21 * 8 + lVar4 * lVar19);
          uVar21 = uVar21 + 3;
        } while (uVar21 != 0x1a);
        local_2980 = local_2980 + 4;
        uVar24 = uVar24 + 1;
        uVar17 = uVar17 + lVar23;
        lVar19 = lVar19 + 0x18;
        lVar28 = lVar28 + 0x18;
        lVar27 = lVar27 + 0x18;
        lVar23 = lVar23 + -2;
        if (uVar24 == 8) {
          return;
        }
      } while( true );
    }
    pcVar14 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 8, 8, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 8, 8, 1>]"
    ;
  }
  else {
    pcVar14 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 64, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 64, 0>]"
    ;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar14);
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalJacobianPreInt(ChMatrixRef& H,
                                                           double Kfactor,
                                                           double Rfactor,
                                                           double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  Since computationally expensive quantities are
    // required for both the generalized internal force vector and its Jacobian, these values were cached for reuse
    // during this Jacobian calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    ChMatrixNMc<double, 9, NSF* NSF> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations as well as the Mass Matrix which is stored in compact upper
    // triangular form
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            unsigned int idx;
            // Convert from a (i,j) index to a linear index into the Mass Matrix in Compact Upper Triangular Form
            // https://math.stackexchange.com/questions/2134011/conversion-of-upper-triangle-linear-index-from-index-on-symmetrical-array
            if (j >= i) {
                idx = (NSF * (NSF - 1) - (NSF - i) * (NSF - i - 1)) / 2 + j;
            } else {
                idx = (NSF * (NSF - 1) - (NSF - j) * (NSF - j - 1)) / 2 + i;
            }

            double d = ScaledMassMatrix(idx) + K_K13Compact(i, j);
            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
        }
    }
}